

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall
wallet::WalletBatch::WriteActiveScriptPubKeyMan
          (WalletBatch *this,uint8_t type,uint256 *id,bool internal)

{
  long lVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  undefined1 *__str;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  local_70;
  string key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000009,internal) == 0) {
    __str = DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_;
  }
  else {
    __str = DBKeys::ACTIVEINTERNALSPK_abi_cxx11_;
  }
  std::__cxx11::string::string
            ((string *)&key,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
  std::__cxx11::string::string((string *)&local_70,&key);
  local_70.second = type;
  bVar2 = WriteIC<std::pair<std::__cxx11::string,unsigned_char>,uint256>(this,&local_70,id,true);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&key);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteActiveScriptPubKeyMan(uint8_t type, const uint256& id, bool internal)
{
    std::string key = internal ? DBKeys::ACTIVEINTERNALSPK : DBKeys::ACTIVEEXTERNALSPK;
    return WriteIC(make_pair(key, type), id);
}